

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdObjSort(If_DsdMan_t *pMan,Vec_Ptr_t *p,int *pLits,int nLits,int *pPerm)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = 1;
  if (1 < nLits) {
    iVar1 = nLits;
  }
  uVar8 = 1;
  for (uVar6 = 0; uVar6 != iVar1 - 1; uVar6 = uVar6 + 1) {
    uVar5 = uVar6 & 0xffffffff;
    uVar7 = uVar8;
    while( true ) {
      uVar4 = (uint)uVar5;
      if ((uint)nLits == uVar7) break;
      iVar2 = If_DsdObjCompare(pMan,p,pLits[(int)uVar4],pLits[uVar7]);
      uVar3 = (uint)uVar7;
      if (iVar2 != 1) {
        uVar3 = uVar4;
      }
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)uVar3;
    }
    if (uVar6 != uVar5) {
      iVar2 = pLits[uVar6];
      pLits[uVar6] = pLits[(int)uVar4];
      pLits[(int)uVar4] = iVar2;
      if (pPerm != (int *)0x0) {
        iVar2 = pPerm[uVar6];
        pPerm[uVar6] = pPerm[(int)uVar4];
        pPerm[(int)uVar4] = iVar2;
      }
    }
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

void If_DsdObjSort( If_DsdMan_t * pMan, Vec_Ptr_t * p, int * pLits, int nLits, int * pPerm )
{
    int i, j, best_i;
    for ( i = 0; i < nLits-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nLits; j++ )
            if ( If_DsdObjCompare(pMan, p, pLits[best_i], pLits[j]) == 1 )
                best_i = j;
        if ( i == best_i )
            continue;
        ABC_SWAP( int, pLits[i], pLits[best_i] );
        if ( pPerm )
            ABC_SWAP( int, pPerm[i], pPerm[best_i] );
    }
}